

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_certificate_request(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  mbedtls_ssl_ciphersuite_t *pmVar2;
  uchar *puVar3;
  uchar uVar4;
  int iVar5;
  mbedtls_ssl_key_cert *pmVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  mbedtls_pk_context *pmVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  
  pmVar2 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x945,"=> parse certificate request");
  if (pmVar2->key_exchange - MBEDTLS_KEY_EXCHANGE_PSK < 4) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x94c,"<= skip parse certificate request");
    ssl->state = ssl->state + 1;
    return 0;
  }
  if (ssl->record_read == 0) {
    iVar9 = mbedtls_ssl_read_record(ssl);
    if (iVar9 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x955,"mbedtls_ssl_read_record",iVar9);
      return iVar9;
    }
    if (ssl->in_msgtype != 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x95b,"bad certificate request message");
      return -0x7700;
    }
    ssl->record_read = 1;
  }
  ssl->client_auth = 0;
  ssl->state = ssl->state + 1;
  if (*ssl->in_msg == '\r') {
    ssl->client_auth = 1;
    pcVar11 = "a";
  }
  else {
    pcVar11 = "no";
  }
  iVar9 = 0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x969,"got %s certificate request",pcVar11);
  if (ssl->client_auth == 0) {
LAB_00164e3c:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x9c5,"<= parse certificate request");
  }
  else {
    ssl->record_read = 0;
    puVar3 = ssl->in_msg;
    uVar12 = (ulong)((ssl->conf->field_0x164 & 2) >> 1);
    uVar13 = (ulong)puVar3[uVar12 * 8 + 4];
    if (ssl->in_hslen < uVar13 + uVar12 * 8 + 6) {
      iVar9 = 0x984;
    }
    else {
      if (uVar13 != 0) {
        lVar8 = uVar12 * 8 + 5;
        uVar12 = 0;
        iVar14 = 1;
        do {
          uVar4 = puVar3[uVar12 + lVar8];
          if (uVar4 == '\x01') {
            if (((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
                (pmVar6 = ssl->handshake->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) &&
               (pmVar6 = ssl->conf->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar10 = (mbedtls_pk_context *)0x0;
            }
            else {
              pmVar10 = pmVar6->key;
            }
            iVar5 = mbedtls_pk_can_do(pmVar10,MBEDTLS_PK_RSA);
            if (iVar5 == 0) {
              uVar4 = puVar3[uVar12 + lVar8];
              goto LAB_00164cf0;
            }
LAB_00164d86:
            ssl->handshake->cert_type = iVar14;
            break;
          }
LAB_00164cf0:
          if (uVar4 == '@') {
            if (((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
                (pmVar6 = ssl->handshake->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) &&
               (pmVar6 = ssl->conf->key_cert, pmVar6 == (mbedtls_ssl_key_cert *)0x0)) {
              pmVar10 = (mbedtls_pk_context *)0x0;
            }
            else {
              pmVar10 = pmVar6->key;
            }
            iVar5 = mbedtls_pk_can_do(pmVar10,MBEDTLS_PK_ECDSA);
            if (iVar5 != 0) {
              iVar14 = 0x40;
              goto LAB_00164d86;
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
      uVar1 = *(uint *)&ssl->conf->field_0x164;
      if (ssl->minor_ver == 3) {
        uVar7 = (ulong)(uVar1 & 2);
        uVar13 = uVar13 + (ushort)(*(ushort *)(puVar3 + uVar13 + uVar7 * 4 + 5) << 8 |
                                  *(ushort *)(puVar3 + uVar13 + uVar7 * 4 + 5) >> 8);
        uVar12 = ssl->in_hslen;
        lVar8 = 2;
        if (uVar12 < uVar13 + uVar7 * 4 + 6) {
          iVar9 = 0x9b2;
          goto LAB_00164e7b;
        }
      }
      else {
        uVar12 = ssl->in_hslen;
        lVar8 = 0;
      }
      uVar7 = (ulong)((uVar1 & 2) != 0);
      if (uVar12 == (ulong)(ushort)(*(ushort *)(puVar3 + uVar13 + lVar8 + uVar7 * 8 + 5) << 8 |
                                   *(ushort *)(puVar3 + uVar13 + lVar8 + uVar7 * 8 + 5) >> 8) +
                    uVar13 + lVar8 + uVar7 * 8 + 7) goto LAB_00164e3c;
      iVar9 = 0x9c0;
    }
LAB_00164e7b:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar9,"bad certificate request message");
    iVar9 = -0x7a80;
  }
  return iVar9;
}

Assistant:

static int ssl_parse_certificate_request( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf, *p;
    size_t n = 0, m = 0;
    size_t cert_type_len = 0, dn_len = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate request" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate request" ) );
        ssl->state++;
        return( 0 );
    }

    if( ssl->record_read == 0 )
    {
        if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
            return( ret );
        }

        if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        ssl->record_read = 1;
    }

    ssl->client_auth = 0;
    ssl->state++;

    if( ssl->in_msg[0] == MBEDTLS_SSL_HS_CERTIFICATE_REQUEST )
        ssl->client_auth++;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "got %s certificate request",
                        ssl->client_auth ? "a" : "no" ) );

    if( ssl->client_auth == 0 )
        goto exit;

    ssl->record_read = 0;

    // TODO: handshake_failure alert for an anonymous server to request
    // client authentication

    /*
     *  struct {
     *      ClientCertificateType certificate_types<1..2^8-1>;
     *      SignatureAndHashAlgorithm
     *        supported_signature_algorithms<2^16-1>; -- TLS 1.2 only
     *      DistinguishedName certificate_authorities<0..2^16-1>;
     *  } CertificateRequest;
     */
    buf = ssl->in_msg;

    // Retrieve cert types
    //
    cert_type_len = buf[mbedtls_ssl_hs_hdr_len( ssl )];
    n = cert_type_len;

    if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

    p = buf + mbedtls_ssl_hs_hdr_len( ssl ) + 1;
    while( cert_type_len > 0 )
    {
#if defined(MBEDTLS_RSA_C)
        if( *p == MBEDTLS_SSL_CERT_TYPE_RSA_SIGN &&
            mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_RSA ) )
        {
            ssl->handshake->cert_type = MBEDTLS_SSL_CERT_TYPE_RSA_SIGN;
            break;
        }
        else
#endif
#if defined(MBEDTLS_ECDSA_C)
        if( *p == MBEDTLS_SSL_CERT_TYPE_ECDSA_SIGN &&
            mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_ECDSA ) )
        {
            ssl->handshake->cert_type = MBEDTLS_SSL_CERT_TYPE_ECDSA_SIGN;
            break;
        }
        else
#endif
        {
            ; /* Unsupported cert type, ignore */
        }

        cert_type_len--;
        p++;
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /* Ignored, see comments about hash in write_certificate_verify */
        // TODO: should check the signature part against our pk_key though
        size_t sig_alg_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + n] <<  8 )
                             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n]       ) );

        m += 2;
        n += sig_alg_len;

        if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    /* Ignore certificate_authorities, we only have one cert anyway */
    // TODO: should not send cert if no CA matches
    dn_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + m + n] <<  8 )
             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + m + n]       ) );

    n += dn_len;
    if( ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 3 + m + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

exit:
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate request" ) );

    return( 0 );
}